

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

void __thiscall BVSparse<Memory::Recycler>::ClearAll(BVSparse<Memory::Recycler> *this)

{
  BVSparseNode<Memory::Recycler> *pBVar1;
  BVSparseNode<Memory::Recycler> *buffer;
  
  buffer = (this->head).ptr;
  while (buffer != (BVSparseNode<Memory::Recycler> *)0x0) {
    pBVar1 = (buffer->next).ptr;
    Memory::Recycler::ExplicitFreeNonLeaf(this->alloc,buffer,0x18);
    buffer = pBVar1;
  }
  (this->head).ptr = (BVSparseNode<Memory::Recycler> *)0x0;
  (this->lastFoundIndex).ptr = (BVSparseNode<Memory::Recycler> *)0x0;
  Memory::Recycler::WBSetBit((char *)&this->lastUsedNodePrevNextField);
  (this->lastUsedNodePrevNextField).ptr = &this->head;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastUsedNodePrevNextField);
  return;
}

Assistant:

void
BVSparse<TAllocator>::ClearAll()
{
    BVSparseNode* nextNode;
    for(BVSparseNode * node = this->head; node != 0 ; node = nextNode)
    {
        nextNode = node->next;
        QueueInFreeList(node);
    }
    this->head = nullptr;
    this->lastFoundIndex = nullptr;
    this->lastUsedNodePrevNextField = &this->head;
}